

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  uint uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  PathArgument *arg;
  pointer key;
  bool bVar4;
  
  key = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
        _M_impl.super__Vector_impl_data._M_start;
  bVar4 = key == (this->args_).
                 super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl
                 .super__Vector_impl_data._M_finish;
  while (!bVar4) {
    bVar2 = true;
    if (key->kind_ == kindKey) {
      if (root->field_0x8 == '\a') {
        root = Value::operator[](root,&key->key_);
        Value::nullSingleton();
        if (root == &Value::nullSingleton::nullStatic) {
          Value::Value(__return_storage_ptr__,defaultValue);
          bVar2 = false;
          root = &Value::nullSingleton::nullStatic;
        }
      }
      else {
LAB_0049349d:
        Value::Value(__return_storage_ptr__,defaultValue);
        bVar2 = false;
      }
    }
    else if (key->kind_ == kindIndex) {
      if ((root->field_0x8 != '\x06') ||
         (uVar1 = key->index_, AVar3 = Value::size(root), AVar3 <= uVar1)) goto LAB_0049349d;
      root = Value::operator[](root,key->index_);
    }
    if (!bVar2) break;
    key = key + 1;
    bVar4 = key == (this->args_).
                   super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
  }
  if (bVar4) {
    Value::Value(__return_storage_ptr__,root);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton())
        return defaultValue;
    }
  }
  return *node;
}